

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O2

word Sbd_ManSolve(sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivSet,Vec_Int_t *vDivVars,
                 Vec_Int_t *vDivValues,Vec_Int_t *vTemp)

{
  uint uVar1;
  int *piVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  word wVar7;
  ulong uVar8;
  ulong uVar9;
  int pLits [2];
  ulong local_50;
  sat_solver *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  iVar3 = sat_solver_nvars(pSat);
  if (iVar3 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                  ,0xb7,
                  "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  local_50 = CONCAT44(local_50._4_4_,FreeVar);
  if (vDivVars->nSize != vDivValues->nSize) {
    __assert_fail("Vec_IntSize(vDivVars) == Vec_IntSize(vDivValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                  ,0xb8,
                  "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  pLits[0] = Abc_Var2Lit(PivotVar,0);
  pLits[1] = Abc_Var2Lit((int)local_50,0);
  local_50 = 0;
  local_48 = pSat;
  local_40 = vDivVars;
  local_38 = vDivValues;
  while( true ) {
    p_00 = local_38;
    p = local_40;
    iVar3 = sat_solver_solve(pSat,pLits,(lit *)&local_50,0,0,0,0);
    if (iVar3 != 1) {
      if (iVar3 == -1) {
        return local_50;
      }
      if (iVar3 == 0) {
        return 0x1234567812345678;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                    ,0xc3,
                    "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (lVar6 = 0; lVar6 < p->nSize; lVar6 = lVar6 + 1) {
      iVar3 = Vec_IntEntry(p,(int)lVar6);
      iVar3 = sat_solver_var_value(pSat,iVar3);
      if (p_00->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p_00->pArray[lVar6] = iVar3 * 2;
    }
    vTemp->nSize = 0;
    iVar3 = Abc_LitNot(pLits[0]);
    Vec_IntPush(vTemp,iVar3);
    for (iVar3 = 0; iVar3 < vDivSet->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(vDivSet,iVar3);
      iVar4 = sat_solver_var_literal(pSat,iVar4);
      Vec_IntPush(vTemp,iVar4);
    }
    iVar3 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,0,0,0,0);
    if (iVar3 != -1) break;
    piVar2 = (pSat->conf_final).ptr;
    uVar1 = (pSat->conf_final).size;
    vTemp->nSize = 0;
    iVar3 = Abc_LitNot(pLits[1]);
    Vec_IntPush(vTemp,iVar3);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    uVar8 = 0xffffffffffffffff;
    for (uVar9 = 0; pSat = local_48, uVar1 != uVar9; uVar9 = uVar9 + 1) {
      if (piVar2[uVar9] != pLits[0]) {
        Vec_IntPush(vTemp,piVar2[uVar9]);
        iVar3 = Abc_Lit2Var(piVar2[uVar9]);
        uVar5 = Vec_IntFind(vDivSet,iVar3);
        if ((int)uVar5 < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                        ,0xdd,
                        "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar3 = Abc_LitIsCompl(piVar2[uVar9]);
        uVar8 = uVar8 & ((long)(iVar3 + -1) ^ s_Truths6[uVar5]);
      }
    }
    iVar3 = sat_solver_addclause(local_48,vTemp->pArray,vTemp->pArray + vTemp->nSize);
    local_50 = local_50 | uVar8;
    if (iVar3 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                    ,0xe2,
                    "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
  }
  wVar7 = 0x1234567812345678;
  if (iVar3 != 0) {
    if (iVar3 != 1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                    ,0xd2,
                    "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (iVar3 = 0; iVar3 < p->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(p,iVar3);
      iVar4 = sat_solver_var_value(pSat,iVar4);
      Vec_IntAddToEntry(p_00,iVar3,iVar4);
    }
    wVar7 = 0x8765432187654321;
    for (iVar3 = 0; iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
      Vec_IntAddToEntry(p_00,iVar3,0xc);
    }
  }
  return wVar7;
}

Assistant:

word Sbd_ManSolve( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivSet, Vec_Int_t * vDivVars, Vec_Int_t * vDivValues, Vec_Int_t * vTemp )
{
    int nBTLimit = 0;
    word uCube, uTruth = 0;
    int status, i, iVar, nFinal, * pFinal, pLits[2], nIter = 0;
    assert( FreeVar < sat_solver_nvars(pSat) );
    assert( Vec_IntSize(vDivVars) == Vec_IntSize(vDivValues) );
    pLits[0] = Abc_Var2Lit( PivotVar, 0 ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SBD_SAT_UNDEC;
        if ( status == l_False )
            return uTruth;
        assert( status == l_True );
        // remember variable values
        Vec_IntForEachEntry( vDivVars, iVar, i )
            Vec_IntWriteEntry( vDivValues, i, 2*sat_solver_var_value(pSat, iVar) );
        // collect divisor literals
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( vDivSet, iVar, i )
            Vec_IntPush( vTemp, sat_solver_var_literal(pSat, iVar) );
        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SBD_SAT_UNDEC;
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        uCube = ~(word)0;
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( vTemp, pFinal[i] );
            iVar = Vec_IntFind( vDivSet, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp) );
        assert( status );
        nIter++;
    }
    assert( status == l_True );
    // store the counter-example
    Vec_IntForEachEntry( vDivVars, iVar, i )
        Vec_IntAddToEntry( vDivValues, i, sat_solver_var_value(pSat, iVar) );

    for ( i = 0; i < Vec_IntSize(vDivValues); i++ )
        Vec_IntAddToEntry( vDivValues, i, 0xC );
/*
    // reduce the counter example
    for ( n = 0; n < 2; n++ )
    {
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_Var2Lit(PivotVar, n) ); // n = 0 => F = 1  (expanding offset against onset)
        for ( i = 0; i < Vec_IntSize(vValues); i++ )
            Vec_IntPush( vTemp, Abc_Var2Lit(i, !((Vec_IntEntry(vValues, i) >> n) & 1)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp), nBTLimit, 0, 0, 0 );
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        for ( i = 0; i < nFinal; i++ )
            if ( Abc_Lit2Var(pFinal[i]) != PivotVar )
                Vec_IntAddToEntry( vValues, Abc_Lit2Var(pFinal[i]), 1 << (n+2) );
    }
*/
    return SBD_SAT_SAT;
}